

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
argument_loader<kratos::FSMState*,std::shared_ptr<kratos::FSMState>const&,std::shared_ptr<kratos::Var>const&>
::load_impl_sequence<0ul,1ul,2ul>
          (argument_loader<kratos::FSMState*,std::shared_ptr<kratos::FSMState>const&,std::shared_ptr<kratos::Var>const&>
           *this,long call)

{
  bool bVar1;
  type_caster_generic *this_00;
  reference pvVar2;
  copyable_holder_caster<kratos::FSMState,_std::shared_ptr<kratos::FSMState>,_void> *this_01;
  copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void> *this_02;
  byte local_69;
  reference local_68;
  handle local_58;
  reference local_50;
  handle local_40;
  reference local_38;
  handle local_28;
  long local_20;
  function_call *call_local;
  argument_loader<kratos::FSMState_*,_const_std::shared_ptr<kratos::FSMState>_&,_const_std::shared_ptr<kratos::Var>_&>
  *this_local;
  
  local_20 = call;
  call_local = (function_call *)this;
  this_00 = (type_caster_generic *)
            std::
            get<0ul,pybind11::detail::type_caster<kratos::FSMState,void>,pybind11::detail::type_caster<std::shared_ptr<kratos::FSMState>,void>,pybind11::detail::type_caster<std::shared_ptr<kratos::Var>,void>>
                      ((tuple<pybind11::detail::type_caster<kratos::FSMState,_void>,_pybind11::detail::type_caster<std::shared_ptr<kratos::FSMState>,_void>,_pybind11::detail::type_caster<std::shared_ptr<kratos::Var>,_void>_>
                        *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_20 + 8),
                      0);
  local_28.m_ptr = pvVar2->m_ptr;
  local_38 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),0);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_38);
  bVar1 = type_caster_generic::load(this_00,local_28,bVar1);
  local_69 = 1;
  if (bVar1) {
    this_01 = &std::
               get<1ul,pybind11::detail::type_caster<kratos::FSMState,void>,pybind11::detail::type_caster<std::shared_ptr<kratos::FSMState>,void>,pybind11::detail::type_caster<std::shared_ptr<kratos::Var>,void>>
                         ((tuple<pybind11::detail::type_caster<kratos::FSMState,_void>,_pybind11::detail::type_caster<std::shared_ptr<kratos::FSMState>,_void>,_pybind11::detail::type_caster<std::shared_ptr<kratos::Var>,_void>_>
                           *)this)->
               super_copyable_holder_caster<kratos::FSMState,_std::shared_ptr<kratos::FSMState>,_void>
    ;
    pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                       ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                        (local_20 + 8),1);
    local_40.m_ptr = pvVar2->m_ptr;
    local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),1);
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_50);
    bVar1 = copyable_holder_caster<kratos::FSMState,_std::shared_ptr<kratos::FSMState>,_void>::load
                      (this_01,local_40,bVar1);
    local_69 = 1;
    if (bVar1) {
      this_02 = &std::
                 get<2ul,pybind11::detail::type_caster<kratos::FSMState,void>,pybind11::detail::type_caster<std::shared_ptr<kratos::FSMState>,void>,pybind11::detail::type_caster<std::shared_ptr<kratos::Var>,void>>
                           ((tuple<pybind11::detail::type_caster<kratos::FSMState,_void>,_pybind11::detail::type_caster<std::shared_ptr<kratos::FSMState>,_void>,_pybind11::detail::type_caster<std::shared_ptr<kratos::Var>,_void>_>
                             *)this)->
                 super_copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>;
      pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                         ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                          (local_20 + 8),2);
      local_58.m_ptr = pvVar2->m_ptr;
      local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),2);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_68);
      bVar1 = copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>::load
                        (this_02,local_58,bVar1);
      local_69 = bVar1 ^ 0xff;
    }
  }
  return (local_69 & 1) == 0;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }